

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

double dist_average_time<double,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::uniform_real_distribution<double>>
                 (uniform_real_distribution<double> *dist,
                 mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 *generator,size_t trials,size_t times)

{
  long lVar1;
  uniform_real_distribution<double> *in_RCX;
  timer *in_RDX;
  double dVar2;
  undefined1 auVar3 [16];
  timer elapsed;
  size_t i;
  double average_time;
  timer *this;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *generator_00;
  
  generator_00 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  *)0x0;
  for (this = (timer *)0x0; this < in_RDX; this = (timer *)((long)&(this->start).__d.__r + 1)) {
    timer::timer(this);
    dist_single_run<double,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::uniform_real_distribution<double>>
              (in_RCX,generator_00,(size_t)this);
    dVar2 = timer::elapsed((timer *)in_RCX);
    generator_00 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                    *)(dVar2 + (double)generator_00);
  }
  lVar1 = (long)in_RDX * (long)in_RCX;
  auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar3._0_8_ = lVar1;
  auVar3._12_4_ = 0x45300000;
  return (((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / (double)generator_00) /
         1000000.0;
}

Assistant:

double dist_average_time(D& dist, G& generator, size_t trials, size_t times ) {
    double average_time = 0.0;

    for ( size_t i = 0; i < trials; ++i ) {
        timer elapsed;
        dist_single_run<Real>( dist, generator, times );
        average_time += elapsed.elapsed();
    }

    return trials * times / average_time / 1000000.0;
}